

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator=
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_> *fadexpr)

{
  uint ssize;
  ulong uVar1;
  int i;
  ulong uVar2;
  Fad<double> *this_00;
  value_type local_50;
  
  ssize = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  if (ssize != *(uint *)(this + 0x28)) {
    Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),ssize);
  }
  if (ssize != 0) {
    this_00 = *(Fad<double> **)(this + 0x30);
    uVar1 = 0;
    if (0 < (int)ssize) {
      uVar1 = (ulong)ssize;
    }
    if ((((fadexpr->fadexpr_).left_)->dx_).num_elts == 0) {
      for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::dx
                  (&local_50,&fadexpr->fadexpr_,(int)uVar2);
        Fad<double>::operator=(this_00,&local_50);
        Fad<double>::~Fad(&local_50);
        this_00 = this_00 + 1;
      }
    }
    else {
      for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::fastAccessDx
                  (&local_50,&fadexpr->fadexpr_,(int)uVar2);
        Fad<double>::operator=(this_00,&local_50);
        Fad<double>::~Fad(&local_50);
        this_00 = this_00 + 1;
      }
    }
  }
  FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::val(&local_50,&fadexpr->fadexpr_);
  Fad<double>::operator=((Fad<double> *)(this + 8),&local_50);
  Fad<double>::~Fad(&local_50);
  return (Fad<Fad<double>_> *)this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}